

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

termline * lineptr(Terminal *term,wchar_t y,wchar_t lineno,wchar_t screen)

{
  int iVar1;
  compressed_scrollback_line *line_00;
  compressed_scrollback_line *cline;
  wchar_t altlines;
  wchar_t treeindex;
  tree234 *whichtree;
  termline *line;
  wchar_t screen_local;
  wchar_t lineno_local;
  wchar_t y_local;
  Terminal *term_local;
  
  if (y < L'\0') {
    cline._0_4_ = L'\0';
    if (screen != L'\0') {
      __assert_fail("!screen",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x45e,"termline *lineptr(Terminal *, int, int, int)");
    }
    if ((((term->erase_to_scrollback & 1U) != 0) && (term->alt_which != L'\0')) &&
       (term->alt_screen != (tree234 *)0x0)) {
      cline._0_4_ = term->alt_sblines;
    }
    if (SBORROW4(y,-(wchar_t)cline) == y + (wchar_t)cline < 0) {
      _altlines = term->alt_screen;
      cline._4_4_ = y + term->alt_sblines;
    }
    else {
      _altlines = term->scrollback;
      iVar1 = count234(term->scrollback);
      cline._4_4_ = y + (wchar_t)cline + iVar1;
    }
  }
  else {
    _altlines = term->screen;
    cline._4_4_ = y;
  }
  if (_altlines == term->scrollback) {
    line_00 = (compressed_scrollback_line *)index234(_altlines,cline._4_4_);
    if (line_00 == (compressed_scrollback_line *)0x0) {
      null_line_error(term,y,lineno,_altlines,cline._4_4_,"cline");
    }
    whichtree = (tree234 *)decompressline(line_00);
  }
  else {
    whichtree = (tree234 *)index234(_altlines,cline._4_4_);
  }
  if (whichtree == (tree234 *)0x0) {
    null_line_error(term,y,lineno,_altlines,cline._4_4_,"line");
    __assert_fail("line != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x479,"termline *lineptr(Terminal *, int, int, int)");
  }
  if (*(wchar_t *)((long)&whichtree->root + 4) < term->cols) {
    resizeline(term,(termline *)whichtree,term->cols);
  }
  return (termline *)whichtree;
}

Assistant:

static termline *lineptr(Terminal *term, int y, int lineno, int screen)
{
    termline *line;
    tree234 *whichtree;
    int treeindex;

    if (y >= 0) {
        whichtree = term->screen;
        treeindex = y;
    } else {
        int altlines = 0;

        assert(!screen);

        if (term->erase_to_scrollback &&
            term->alt_which && term->alt_screen) {
            altlines = term->alt_sblines;
        }
        if (y < -altlines) {
            whichtree = term->scrollback;
            treeindex = y + altlines + count234(term->scrollback);
        } else {
            whichtree = term->alt_screen;
            treeindex = y + term->alt_sblines;
            /* treeindex = y + count234(term->alt_screen); */
        }
    }
    if (whichtree == term->scrollback) {
        compressed_scrollback_line *cline = index234(whichtree, treeindex);
        if (!cline)
            null_line_error(term, y, lineno, whichtree, treeindex, "cline");
        line = decompressline(cline);
    } else {
        line = index234(whichtree, treeindex);
    }

    /* We assume that we don't screw up and retrieve something out of range. */
    if (line == NULL)
        null_line_error(term, y, lineno, whichtree, treeindex, "line");
    assert(line != NULL);

    /*
     * Here we resize lines to _at least_ the right length, but we
     * don't truncate them. Truncation is done as a side effect of
     * modifying the line.
     *
     * The point of this policy is to try to arrange that resizing the
     * terminal window repeatedly - e.g. successive steps in an X11
     * opaque window-resize drag, or resizing as a side effect of
     * retiling by tiling WMs such as xmonad - does not throw away
     * data gratuitously. Specifically, we want a sequence of resize
     * operations with no terminal output between them to have the
     * same effect as a single resize to the ultimate terminal size,
     * and also (for the case in which xmonad narrows a window that's
     * scrolling things) we want scrolling up new text at the bottom
     * of a narrowed window to avoid truncating lines further up when
     * the window is re-widened.
     */
    if (term->cols > line->cols)
        resizeline(term, line, term->cols);

    return line;
}